

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

bool __thiscall
perfetto::protos::gen::TracingServiceState::ParseFromArray
          (TracingServiceState *this,void *raw,size_t size)

{
  byte bVar1;
  pointer pTVar2;
  pointer pTVar3;
  pointer pTVar4;
  pointer pTVar5;
  pointer pTVar6;
  pointer pTVar7;
  bool bVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ulong *puVar13;
  ulong *puVar14;
  uint8_t cur_byte_2;
  uint8_t cur_byte;
  ulong uVar15;
  uint8_t cur_byte_1;
  pointer pTVar16;
  pointer pTVar17;
  pointer pTVar18;
  ulong *puVar19;
  Field local_68;
  string *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  vector<perfetto::protos::gen::TracingServiceState_TracingSession,_std::allocator<perfetto::protos::gen::TracingServiceState_TracingSession>_>
  *local_48;
  vector<perfetto::protos::gen::TracingServiceState_DataSource,_std::allocator<perfetto::protos::gen::TracingServiceState_DataSource>_>
  *local_40;
  vector<perfetto::protos::gen::TracingServiceState_Producer,_std::allocator<perfetto::protos::gen::TracingServiceState_Producer>_>
  *local_38;
  
  pTVar2 = (this->producers_).
           super__Vector_base<perfetto::protos::gen::TracingServiceState_Producer,_std::allocator<perfetto::protos::gen::TracingServiceState_Producer>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pTVar3 = (this->producers_).
           super__Vector_base<perfetto::protos::gen::TracingServiceState_Producer,_std::allocator<perfetto::protos::gen::TracingServiceState_Producer>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pTVar16 = pTVar2;
  if (pTVar3 != pTVar2) {
    do {
      (**(pTVar16->super_CppMessageObj)._vptr_CppMessageObj)(pTVar16);
      pTVar16 = pTVar16 + 1;
    } while (pTVar16 != pTVar3);
    (this->producers_).
    super__Vector_base<perfetto::protos::gen::TracingServiceState_Producer,_std::allocator<perfetto::protos::gen::TracingServiceState_Producer>_>
    ._M_impl.super__Vector_impl_data._M_finish = pTVar2;
  }
  pTVar4 = (this->data_sources_).
           super__Vector_base<perfetto::protos::gen::TracingServiceState_DataSource,_std::allocator<perfetto::protos::gen::TracingServiceState_DataSource>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pTVar5 = (this->data_sources_).
           super__Vector_base<perfetto::protos::gen::TracingServiceState_DataSource,_std::allocator<perfetto::protos::gen::TracingServiceState_DataSource>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pTVar17 = pTVar4;
  if (pTVar5 != pTVar4) {
    do {
      (**(pTVar17->super_CppMessageObj)._vptr_CppMessageObj)(pTVar17);
      pTVar17 = pTVar17 + 1;
    } while (pTVar17 != pTVar5);
    (this->data_sources_).
    super__Vector_base<perfetto::protos::gen::TracingServiceState_DataSource,_std::allocator<perfetto::protos::gen::TracingServiceState_DataSource>_>
    ._M_impl.super__Vector_impl_data._M_finish = pTVar4;
  }
  pTVar6 = (this->tracing_sessions_).
           super__Vector_base<perfetto::protos::gen::TracingServiceState_TracingSession,_std::allocator<perfetto::protos::gen::TracingServiceState_TracingSession>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pTVar7 = (this->tracing_sessions_).
           super__Vector_base<perfetto::protos::gen::TracingServiceState_TracingSession,_std::allocator<perfetto::protos::gen::TracingServiceState_TracingSession>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pTVar18 = pTVar6;
  if (pTVar7 != pTVar6) {
    do {
      (**(pTVar18->super_CppMessageObj)._vptr_CppMessageObj)(pTVar18);
      pTVar18 = pTVar18 + 1;
    } while (pTVar18 != pTVar7);
    (this->tracing_sessions_).
    super__Vector_base<perfetto::protos::gen::TracingServiceState_TracingSession,_std::allocator<perfetto::protos::gen::TracingServiceState_TracingSession>_>
    ._M_impl.super__Vector_impl_data._M_finish = pTVar6;
  }
  local_38 = &this->producers_;
  local_40 = &this->data_sources_;
  (this->unknown_fields_)._M_string_length = 0;
  local_48 = &this->tracing_sessions_;
  local_50 = &this->unknown_fields_;
  *(this->unknown_fields_)._M_dataplus._M_p = '\0';
  puVar13 = (ulong *)(size + (long)raw);
  do {
    if (puVar13 <= raw) goto switchD_0022d01f_caseD_3;
    bVar1 = (byte)*raw;
    uVar12 = (ulong)bVar1;
    puVar14 = (ulong *)((long)raw + 1);
    if ((char)bVar1 < '\0') {
      uVar12 = (ulong)(bVar1 & 0x7f);
      lVar10 = 7;
      do {
        if ((puVar13 <= puVar14) || (0x38 < lVar10 - 7U)) goto switchD_0022d01f_caseD_3;
        uVar9 = *puVar14;
        puVar14 = (ulong *)((long)puVar14 + 1);
        uVar12 = uVar12 | (ulong)((byte)uVar9 & 0x7f) << ((byte)lVar10 & 0x3f);
        lVar10 = lVar10 + 7;
      } while ((char)(byte)uVar9 < '\0');
    }
    uVar9 = uVar12 >> 3;
    if (((uint)uVar9 == 0) || (puVar13 <= puVar14)) goto switchD_0022d01f_caseD_3;
    switch((uint)uVar12 & 7) {
    case 0:
      uVar11 = 0;
      uVar15 = 0;
      while( true ) {
        puVar19 = (ulong *)((long)puVar14 + 1);
        uVar11 = (ulong)((byte)*puVar14 & 0x7f) << ((byte)uVar15 & 0x3f) | uVar11;
        if (-1 < (char)(byte)*puVar14) break;
        if ((puVar13 <= puVar19) ||
           (bVar8 = 0x38 < uVar15, uVar15 = uVar15 + 7, puVar14 = puVar19, bVar8))
        goto switchD_0022d01f_caseD_3;
      }
      local_68.int_value_ = uVar11 & 0xffffffff00000000;
      break;
    case 1:
      puVar19 = puVar14 + 1;
      if (puVar13 < puVar19) goto switchD_0022d01f_caseD_3;
      uVar11 = *puVar14;
      local_68.int_value_ = uVar11 & 0xffffffff00000000;
      break;
    case 2:
      puVar14 = (ulong *)((long)puVar14 + 1);
      uVar15 = 0;
      uVar11 = 0;
      puVar19 = puVar14;
      while (uVar15 = (ulong)(*(byte *)((long)puVar19 + -1) & 0x7f) << ((byte)uVar11 & 0x3f) |
                      uVar15, (char)*(byte *)((long)puVar19 + -1) < '\0') {
        if (puVar13 <= puVar19) goto switchD_0022d01f_caseD_3;
        puVar19 = (ulong *)((long)puVar19 + 1);
        puVar14 = (ulong *)((long)puVar14 + 1);
        bVar8 = 0x38 < uVar11;
        uVar11 = uVar11 + 7;
        if (bVar8) goto switchD_0022d01f_caseD_3;
      }
      if (uVar15 <= (ulong)((long)puVar13 - (long)puVar14)) {
        local_68.int_value_ = (ulong)puVar14 & 0xffffffff00000000;
        puVar19 = (ulong *)((long)puVar19 + uVar15);
        uVar11 = (ulong)puVar14 & 0xffffffff;
        goto LAB_0022d0fc;
      }
    default:
      goto switchD_0022d01f_caseD_3;
    case 5:
      puVar19 = (ulong *)((long)puVar14 + 4);
      if (puVar13 < puVar19) goto switchD_0022d01f_caseD_3;
      uVar11 = (ulong)(uint)*puVar14;
      local_68.int_value_ = 0;
    }
    uVar15 = 0;
LAB_0022d0fc:
    raw = puVar19;
  } while ((0xffff < (uint)uVar9) || (0xfffffff < uVar15));
  local_68.int_value_ = local_68.int_value_ | uVar11 & 0xffffffff;
  uVar11 = uVar9 << 0x20 | uVar15;
  local_68.type_ = (byte)(uVar11 >> 0x30) | (byte)uVar12 & 7;
  local_68.size_ = (uint32_t)uVar15;
  local_68.id_ = (uint16_t)(uVar11 >> 0x20);
  if ((short)uVar9 != 0) {
    local_58 = &this->tracing_service_version_;
    do {
      if ((ushort)uVar9 < 8) {
        (this->_has_field_).super__Base_bitset<1UL>._M_w =
             (this->_has_field_).super__Base_bitset<1UL>._M_w | 1L << ((byte)uVar9 & 0x3f);
      }
      raw = puVar19;
      switch((uint)uVar9 & 0xffff) {
      case 1:
        std::
        vector<perfetto::protos::gen::TracingServiceState_Producer,_std::allocator<perfetto::protos::gen::TracingServiceState_Producer>_>
        ::emplace_back<>(local_38);
        pTVar2 = (this->producers_).
                 super__Vector_base<perfetto::protos::gen::TracingServiceState_Producer,_std::allocator<perfetto::protos::gen::TracingServiceState_Producer>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        (*pTVar2[-1].super_CppMessageObj._vptr_CppMessageObj[4])
                  (pTVar2 + -1,local_68.int_value_,(ulong)local_68.size_);
        break;
      case 2:
        std::
        vector<perfetto::protos::gen::TracingServiceState_DataSource,_std::allocator<perfetto::protos::gen::TracingServiceState_DataSource>_>
        ::emplace_back<>(local_40);
        pTVar4 = (this->data_sources_).
                 super__Vector_base<perfetto::protos::gen::TracingServiceState_DataSource,_std::allocator<perfetto::protos::gen::TracingServiceState_DataSource>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        (*pTVar4[-1].super_CppMessageObj._vptr_CppMessageObj[4])
                  (pTVar4 + -1,local_68.int_value_,(ulong)local_68.size_);
        break;
      case 3:
        this->num_sessions_ = (int32_t)local_68.int_value_;
        break;
      case 4:
        this->num_sessions_started_ = (int32_t)local_68.int_value_;
        break;
      case 5:
        protozero::Field::get(&local_68,local_58);
        break;
      case 6:
        std::
        vector<perfetto::protos::gen::TracingServiceState_TracingSession,_std::allocator<perfetto::protos::gen::TracingServiceState_TracingSession>_>
        ::emplace_back<>(local_48);
        pTVar6 = (this->tracing_sessions_).
                 super__Vector_base<perfetto::protos::gen::TracingServiceState_TracingSession,_std::allocator<perfetto::protos::gen::TracingServiceState_TracingSession>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        (*pTVar6[-1].super_CppMessageObj._vptr_CppMessageObj[4])
                  (pTVar6 + -1,local_68.int_value_,(ulong)local_68.size_);
        break;
      case 7:
        this->supports_tracing_sessions_ = local_68.int_value_ != 0;
        break;
      default:
        protozero::Field::SerializeAndAppendToInternal<std::__cxx11::string>(&local_68,local_50);
      }
      do {
        if (puVar13 <= raw) goto switchD_0022d01f_caseD_3;
        bVar1 = (byte)*raw;
        uVar12 = (ulong)(uint)bVar1;
        puVar14 = (ulong *)((long)raw + 1);
        if ((char)bVar1 < '\0') {
          uVar12 = (ulong)(bVar1 & 0x7f);
          lVar10 = 7;
          do {
            if ((puVar13 <= puVar14) || (0x38 < lVar10 - 7U)) goto switchD_0022d01f_caseD_3;
            uVar9 = *puVar14;
            puVar14 = (ulong *)((long)puVar14 + 1);
            uVar12 = uVar12 | (ulong)((byte)uVar9 & 0x7f) << ((byte)lVar10 & 0x3f);
            lVar10 = lVar10 + 7;
          } while ((char)(byte)uVar9 < '\0');
        }
        uVar9 = uVar12 >> 3;
        if (((uint)uVar9 == 0) || (puVar13 <= puVar14)) goto switchD_0022d01f_caseD_3;
        switch((uint)uVar12 & 7) {
        case 0:
          uVar11 = 0;
          uVar15 = 0;
          while( true ) {
            puVar19 = (ulong *)((long)puVar14 + 1);
            uVar11 = (ulong)((byte)*puVar14 & 0x7f) << ((byte)uVar15 & 0x3f) | uVar11;
            if (-1 < (char)(byte)*puVar14) break;
            if ((puVar13 <= puVar19) ||
               (bVar8 = 0x38 < uVar15, uVar15 = uVar15 + 7, puVar14 = puVar19, bVar8))
            goto switchD_0022d01f_caseD_3;
          }
          local_68.int_value_ = uVar11 & 0xffffffff00000000;
          break;
        case 1:
          puVar19 = puVar14 + 1;
          if (puVar13 < puVar19) goto switchD_0022d01f_caseD_3;
          uVar11 = *puVar14;
          local_68.int_value_ = uVar11 & 0xffffffff00000000;
          break;
        case 2:
          puVar14 = (ulong *)((long)puVar14 + 1);
          uVar15 = 0;
          uVar11 = 0;
          puVar19 = puVar14;
          while (uVar15 = (ulong)(*(byte *)((long)puVar19 + -1) & 0x7f) << ((byte)uVar11 & 0x3f) |
                          uVar15, (char)*(byte *)((long)puVar19 + -1) < '\0') {
            if (puVar13 <= puVar19) goto switchD_0022d01f_caseD_3;
            puVar19 = (ulong *)((long)puVar19 + 1);
            puVar14 = (ulong *)((long)puVar14 + 1);
            bVar8 = 0x38 < uVar11;
            uVar11 = uVar11 + 7;
            if (bVar8) goto switchD_0022d01f_caseD_3;
          }
          if (uVar15 <= (ulong)((long)puVar13 - (long)puVar14)) {
            local_68.int_value_ = (ulong)puVar14 & 0xffffffff00000000;
            puVar19 = (ulong *)((long)puVar19 + uVar15);
            uVar11 = (ulong)puVar14 & 0xffffffff;
            goto LAB_0022d442;
          }
        default:
          goto switchD_0022d01f_caseD_3;
        case 5:
          puVar19 = (ulong *)((long)puVar14 + 4);
          if (puVar13 < puVar19) goto switchD_0022d01f_caseD_3;
          uVar11 = (ulong)(uint)*puVar14;
          local_68.int_value_ = 0;
        }
        uVar15 = 0;
LAB_0022d442:
        raw = puVar19;
      } while ((0xffff < (uint)uVar9) || (0xfffffff < uVar15));
      local_68.int_value_ = local_68.int_value_ | uVar11 & 0xffffffff;
      uVar11 = uVar9 << 0x20 | uVar15;
      local_68.type_ = (byte)(uVar11 >> 0x30) | (byte)uVar12 & 7;
      local_68.size_ = (uint32_t)uVar15;
      local_68.id_ = (uint16_t)(uVar11 >> 0x20);
    } while ((short)uVar9 != 0);
  }
switchD_0022d01f_caseD_3:
  return puVar13 == (ulong *)raw;
}

Assistant:

bool TracingServiceState::ParseFromArray(const void* raw, size_t size) {
  producers_.clear();
  data_sources_.clear();
  tracing_sessions_.clear();
  unknown_fields_.clear();
  bool packed_error = false;

  ::protozero::ProtoDecoder dec(raw, size);
  for (auto field = dec.ReadField(); field.valid(); field = dec.ReadField()) {
    if (field.id() < _has_field_.size()) {
      _has_field_.set(field.id());
    }
    switch (field.id()) {
      case 1 /* producers */:
        producers_.emplace_back();
        producers_.back().ParseFromArray(field.data(), field.size());
        break;
      case 2 /* data_sources */:
        data_sources_.emplace_back();
        data_sources_.back().ParseFromArray(field.data(), field.size());
        break;
      case 6 /* tracing_sessions */:
        tracing_sessions_.emplace_back();
        tracing_sessions_.back().ParseFromArray(field.data(), field.size());
        break;
      case 7 /* supports_tracing_sessions */:
        field.get(&supports_tracing_sessions_);
        break;
      case 3 /* num_sessions */:
        field.get(&num_sessions_);
        break;
      case 4 /* num_sessions_started */:
        field.get(&num_sessions_started_);
        break;
      case 5 /* tracing_service_version */:
        field.get(&tracing_service_version_);
        break;
      default:
        field.SerializeAndAppendTo(&unknown_fields_);
        break;
    }
  }
  return !packed_error && !dec.bytes_left();
}